

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

void arrangeQuoters_superFast_moreThen5
               (word *pInOut,word *temp,int start,int iQ,int jQ,int kQ,int lQ,int iVar,
               char *pCanonPerm,uint *pCanonPhase)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  word *__dest;
  size_t __n;
  
  if (jQ == 1 && iQ == 0) {
    return;
  }
  bVar1 = (char)iVar - 6;
  iVar3 = 1 << (bVar1 & 0x1f);
  lVar2 = (long)iVar3;
  __n = (size_t)(8 << (bVar1 & 0x1f));
  __dest = temp + start;
  for (uVar4 = start - iVar3; 0 < (int)uVar4; uVar4 = uVar4 + (-4 << (bVar1 & 0x1f))) {
    memcpy(__dest + -lVar2,pInOut + ((ulong)uVar4 - (long)(iQ << (bVar1 & 0x1f))),__n);
    memcpy(__dest + lVar2 * -2,pInOut + ((ulong)uVar4 - (long)(jQ << (bVar1 & 0x1f))),__n);
    memcpy(__dest + lVar2 * -3,pInOut + ((ulong)uVar4 - (long)(kQ << (bVar1 & 0x1f))),__n);
    __dest = __dest + lVar2 * -4;
    memcpy(__dest,pInOut + ((ulong)uVar4 - (long)(lQ << (bVar1 & 0x1f))),__n);
  }
  memcpy(pInOut,temp,(long)start << 3);
  updataInfo(iQ,jQ,iVar,pCanonPerm,pCanonPhase);
  return;
}

Assistant:

void arrangeQuoters_superFast_moreThen5(word* pInOut, word* temp, int start,  int iQ, int jQ, int kQ, int lQ, int iVar, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i,wordBlock,blockSize,shiftSize;
    word* tempPtr = temp+start;
//     printf("in arrangeQuoters_superFast_moreThen5\n");

    if(iQ == 0 && jQ == 1)
        return;
    wordBlock = (1<<(iVar-6));
    blockSize = wordBlock*sizeof(word);
    shiftSize = wordBlock*4;
    for(i=start-wordBlock;i>0;i-=shiftSize)
    {       
        tempPtr -= wordBlock;       
        memcpy(tempPtr, pInOut+i-iQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-jQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-kQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-lQ*wordBlock, (size_t)blockSize);      
    }   
    memcpy(pInOut, temp, start*sizeof(word));
    updataInfo(iQ, jQ, iVar, pCanonPerm, pCanonPhase);
//    printf("out arrangeQuoters_superFast_moreThen5\n");

}